

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O2

AdaptiveSnifferResult * __thiscall
duckdb::CSVSniffer::MinimalSniff(AdaptiveSnifferResult *__return_storage_ptr__,CSVSniffer *this)

{
  shared_ptr<duckdb::CSVBufferManager,_true> *this_00;
  unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
  *set_columns;
  idx_t iVar1;
  pointer pMVar2;
  CSVReaderOptions *pCVar3;
  anon_union_16_2_67f50693_for_value *paVar4;
  unsigned_long *puVar5;
  CSVSniffer *this_01;
  CSVReaderOptions *options;
  CSVIterator iterator;
  int iVar6;
  CSVBufferManager *pCVar7;
  reference pvVar8;
  CSVStateMachine *pCVar9;
  pointer pSVar10;
  CSVErrorHandler *this_02;
  undefined4 extraout_var;
  DataChunk *data_chunk;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *pvVar11;
  type pCVar12;
  reference vector;
  MultiFileOptions *file_options;
  mapped_type *pmVar13;
  reference other;
  long lVar14;
  vector<duckdb::ColumnCount,_true> *this_03;
  CSVIterator *pCVar15;
  idx_t *piVar16;
  pointer pbVar17;
  ulong __n;
  byte bVar18;
  idx_t in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  CSVErrorHandler *in_stack_fffffffffffffbd0;
  undefined1 auVar19 [32];
  undefined1 in_stack_fffffffffffffbd8 [40];
  undefined1 local_3f0 [16];
  shared_ptr<duckdb::CSVStateMachine,_true> state_machine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  shared_ptr<duckdb::CSVErrorHandler,_true> *local_398;
  shared_ptr<duckdb::CSVBufferManager,_true> *local_390;
  __shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2> local_388;
  __shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> local_378;
  vector<duckdb::HeaderValue,_true> potential_header;
  vector<duckdb::LogicalType,_true> return_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_328;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_310;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2a8;
  LogicalType d_type;
  LogicalType local_260;
  CSVIterator local_248;
  ColumnCountScanner count_scanner;
  
  bVar18 = 0;
  pvVar11 = &((this->set_columns).types)->
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  if ((pvVar11 == (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)0x0) ||
     ((pvVar11->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (pvVar11->super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
      _M_impl.super__Vector_impl_data._M_finish)) {
    return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = &this->buffer_manager;
    pCVar7 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(this_00);
    pCVar7->sniffing = true;
    make_shared_ptr<duckdb::CSVStateMachine,duckdb::CSVReaderOptions&,duckdb::CSVStateMachineOptions&,duckdb::CSVStateMachineCache&>
              ((CSVReaderOptions *)&state_machine,(CSVStateMachineOptions *)this->options,
               (CSVStateMachineCache *)this->options);
    ::std::__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_378,
               (__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> *)this_00);
    ::std::__shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_388,
               (__shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2> *)
               &this->error_handler);
    CSVIterator::CSVIterator(&local_248);
    pCVar15 = &local_248;
    piVar16 = (idx_t *)&stack0xfffffffffffffbb8;
    for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
      *piVar16 = (pCVar15->pos).buffer_idx;
      pCVar15 = (CSVIterator *)((long)pCVar15 + ((ulong)bVar18 * -2 + 1) * 8);
      piVar16 = piVar16 + (ulong)bVar18 * -2 + 1;
    }
    iterator.pos.buffer_pos = in_stack_fffffffffffffbc0;
    iterator.pos.buffer_idx = in_stack_fffffffffffffbb8;
    iterator.done = (bool)(char)in_stack_fffffffffffffbc8;
    iterator.first_one = (bool)(char)((ulong)in_stack_fffffffffffffbc8 >> 8);
    iterator._18_6_ = (int6)((ulong)in_stack_fffffffffffffbc8 >> 0x10);
    iterator.buffer_size = (idx_t)in_stack_fffffffffffffbd0;
    auVar19 = in_stack_fffffffffffffbd8._0_32_;
    iterator.boundary.buffer_idx = auVar19._0_8_;
    iterator.boundary.buffer_pos = auVar19._8_8_;
    iterator.boundary.boundary_idx = auVar19._16_8_;
    iterator.boundary.end_pos = auVar19._24_8_;
    iterator.is_set = (bool)in_stack_fffffffffffffbd8[0x20];
    iterator._65_7_ = in_stack_fffffffffffffbd8._33_7_;
    ColumnCountScanner::ColumnCountScanner
              (&count_scanner,(shared_ptr<duckdb::CSVBufferManager,_true> *)&local_378,
               &state_machine,(shared_ptr<duckdb::CSVErrorHandler,_true> *)&local_388,0x800,iterator
              );
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_388._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_378._M_refcount);
    local_3f0._8_8_ = ColumnCountScanner::ParseChunk(&count_scanner);
    if ((((element_type *)local_3f0._8_8_)->super_BaseFileReader).column_ids.column_ids.
        super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        .
        super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      local_2a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2c8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2c8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2c8.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AdaptiveSnifferResult::AdaptiveSnifferResult
                (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_2a8,&local_2c8,
                 false);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_2c8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2a8);
    }
    else {
      this_03 = (vector<duckdb::ColumnCount,_true> *)
                &(((element_type *)local_3f0._8_8_)->super_BaseFileReader).columns;
      pvVar8 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,0);
      iVar1 = pvVar8->number_of_columns;
      pCVar9 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(&state_machine);
      (pCVar9->dialect_options).num_cols = iVar1;
      pvVar8 = vector<duckdb::ColumnCount,_true>::get<true>(this_03,0);
      (this->options->dialect_options).num_cols = pvVar8->number_of_columns;
      ColumnCountScanner::UpgradeToStringValueScanner((ColumnCountScanner *)local_3f0);
      pSVar10 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                              *)local_3f0);
      this_02 = shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                          (&(pSVar10->super_BaseScanner).error_handler);
      CSVErrorHandler::SetIgnoreErrors(this_02,true);
      local_398 = &this->error_handler;
      local_390 = this_00;
      pSVar10 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                ::operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                              *)local_3f0);
      iVar6 = (*(pSVar10->super_BaseScanner)._vptr_BaseScanner[2])(pSVar10);
      data_chunk = StringValueResult::ToChunk((StringValueResult *)CONCAT44(extraout_var,iVar6));
      local_3a8._8_8_ = &this->set_columns;
      pMVar2 = (((BaseFileReader *)local_3f0._8_8_)->column_ids).column_ids.
               super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
               .
               super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      set_columns = &this->best_sql_types_candidates_per_column_idx;
      pbVar17 = (pointer)0x0;
      while( true ) {
        names.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar17;
        pCVar9 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(&state_machine);
        if ((pointer)(pCVar9->dialect_options).num_cols <= pbVar17) break;
        pCVar9 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(&state_machine);
        pCVar3 = pCVar9->options;
        pvVar11 = &::std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)set_columns,(key_type *)&names)->
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                  (pvVar11,&(pCVar3->auto_type_candidates).
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
        ;
        pbVar17 = (pointer)((long)&((names.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           1);
      }
      pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator*(&state_machine);
      SniffTypes(this,data_chunk,pCVar12,set_columns,(ulong)(pMVar2 == (pointer)0x2));
      potential_header.super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
      super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      potential_header.super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
      super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      potential_header.super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
      super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (__n = 0; __n < (ulong)(((long)(data_chunk->data).
                                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         .
                                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(data_chunk->data).
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start) / 0x68);
          __n = __n + 1) {
        vector = vector<duckdb::Vector,_true>::get<true>(&data_chunk->data,__n);
        paVar4 = (anon_union_16_2_67f50693_for_value *)vector->data;
        FlatVector::VerifyFlatVector(vector);
        names.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(names.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
        names.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_3b8;
        names.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3b8._M_local_buf[0] = false;
        puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
          HeaderValue::HeaderValue((HeaderValue *)&d_type,(string_t)paVar4->pointer);
          HeaderValue::operator=((HeaderValue *)&names,(HeaderValue *)&d_type);
          ::std::__cxx11::string::~string((string *)&d_type.type_info_);
        }
        ::std::vector<duckdb::HeaderValue,std::allocator<duckdb::HeaderValue>>::
        emplace_back<duckdb::HeaderValue&>
                  ((vector<duckdb::HeaderValue,std::allocator<duckdb::HeaderValue>> *)
                   &potential_header,(HeaderValue *)&names);
        ::std::__cxx11::string::~string
                  ((string *)
                   &names.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      }
      pCVar7 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(local_390);
      this_01 = (CSVSniffer *)pCVar7->context;
      pCVar12 = shared_ptr<duckdb::CSVStateMachine,_true>::operator*(&state_machine);
      pCVar3 = this->options;
      options = (CSVReaderOptions *)this->file_options;
      file_options = (MultiFileOptions *)
                     shared_ptr<duckdb::CSVErrorHandler,_true>::operator*(local_398);
      DetectHeaderInternal_abi_cxx11_
                (&names,this_01,(ClientContext *)&potential_header,
                 (vector<duckdb::HeaderValue,_true> *)pCVar12,(CSVStateMachine *)local_3a8._8_8_,
                 (SetColumns *)set_columns,
                 (unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
                  *)pCVar3,options,file_options,in_stack_fffffffffffffbd0);
      for (local_3a8._M_allocated_capacity = (size_type)(element_type *)0x0;
          local_3a8._M_allocated_capacity <
          (element_type *)(this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count;
          local_3a8._M_allocated_capacity = local_3a8._M_allocated_capacity + 1) {
        pmVar13 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)set_columns,&local_3a8._M_allocated_capacity);
        other = vector<duckdb::LogicalType,_true>::back(pmVar13);
        LogicalType::LogicalType(&d_type,other);
        pmVar13 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)set_columns,&local_3a8._M_allocated_capacity);
        if ((long)(pmVar13->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pmVar13->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                  .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
            (long)(this->options->auto_type_candidates).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->options->auto_type_candidates).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
          LogicalType::LogicalType(&local_260,VARCHAR);
          LogicalType::operator=(&d_type,&local_260);
          LogicalType::~LogicalType(&local_260);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&(this->detected_types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,&d_type)
        ;
        LogicalType::~LogicalType(&d_type);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_310,
                 &(this->detected_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_328,
               &names.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
      AdaptiveSnifferResult::AdaptiveSnifferResult
                (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_310,&local_328,
                 (pointer)0x1 <
                 (((BaseFileReader *)local_3f0._8_8_)->column_ids).column_ids.
                 super_vector<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                 .
                 super__Vector_base<duckdb::MultiFileLocalColumnId,_std::allocator<duckdb::MultiFileLocalColumnId>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_328);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_310);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&names);
      ::std::vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>::~vector
                (&potential_header.
                  super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>);
      if ((tuple<duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>)
          local_3f0._0_8_ != (_Head_base<0UL,_duckdb::StringValueScanner_*,_false>)0x0) {
        (**(code **)(*(_func_int **)local_3f0._0_8_ + 8))();
      }
    }
    ColumnCountScanner::~ColumnCountScanner(&count_scanner);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&state_machine.internal.
                super___shared_ptr<duckdb::CSVStateMachine,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    pvVar11 = &return_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>;
  }
  else {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_2e0,pvVar11);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2f8,
             &((this->set_columns).names)->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
    AdaptiveSnifferResult::AdaptiveSnifferResult
              (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_2e0,&local_2f8,
               true);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2f8);
    pvVar11 = &local_2e0;
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(pvVar11);
  return __return_storage_ptr__;
}

Assistant:

AdaptiveSnifferResult CSVSniffer::MinimalSniff() {
	if (set_columns.IsSet()) {
		// Nothing to see here
		return AdaptiveSnifferResult(*set_columns.types, *set_columns.names, true);
	}
	// Return Types detected
	vector<LogicalType> return_types;
	// Column Names detected
	buffer_manager->sniffing = true;
	constexpr idx_t result_size = STANDARD_VECTOR_SIZE;

	auto state_machine =
	    make_shared_ptr<CSVStateMachine>(options, options.dialect_options.state_machine_options, state_machine_cache);
	ColumnCountScanner count_scanner(buffer_manager, state_machine, error_handler, result_size);
	auto &sniffed_column_counts = count_scanner.ParseChunk();
	if (sniffed_column_counts.result_position == 0) {
		// The file is an empty file, we just return
		return {{}, {}, false};
	}

	state_machine->dialect_options.num_cols = sniffed_column_counts[0].number_of_columns;
	options.dialect_options.num_cols = sniffed_column_counts[0].number_of_columns;

	// First figure out the number of columns on this configuration
	auto scanner = count_scanner.UpgradeToStringValueScanner();
	scanner->error_handler->SetIgnoreErrors(true);
	// Parse chunk and read csv with info candidate
	auto &data_chunk = scanner->ParseChunk().ToChunk();
	idx_t start_row = 0;
	if (sniffed_column_counts.result_position == 2) {
		// If equal to two, we will only use the second row for type checking
		start_row = 1;
	}

	// Gather Types
	for (idx_t i = 0; i < state_machine->dialect_options.num_cols; i++) {
		best_sql_types_candidates_per_column_idx[i] = state_machine->options.auto_type_candidates;
	}
	SniffTypes(data_chunk, *state_machine, best_sql_types_candidates_per_column_idx, start_row);

	// Possibly Gather Header
	vector<HeaderValue> potential_header;
	for (idx_t col_idx = 0; col_idx < data_chunk.ColumnCount(); col_idx++) {
		auto &cur_vector = data_chunk.data[col_idx];
		const auto vector_data = FlatVector::GetData<string_t>(cur_vector);
		auto &validity = FlatVector::Validity(cur_vector);
		HeaderValue val;
		if (validity.RowIsValid(0)) {
			val = HeaderValue(vector_data[0]);
		}
		potential_header.emplace_back(val);
	}

	auto names = DetectHeaderInternal(buffer_manager->context, potential_header, *state_machine, set_columns,
	                                  best_sql_types_candidates_per_column_idx, options, file_options, *error_handler);

	for (idx_t column_idx = 0; column_idx < best_sql_types_candidates_per_column_idx.size(); column_idx++) {
		LogicalType d_type = best_sql_types_candidates_per_column_idx[column_idx].back();
		if (best_sql_types_candidates_per_column_idx[column_idx].size() == options.auto_type_candidates.size()) {
			d_type = LogicalType::VARCHAR;
		}
		detected_types.push_back(d_type);
	}
	return {detected_types, names, sniffed_column_counts.result_position > 1};
}